

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O1

void printPCRelImm(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_mode cVar2;
  cs_detail *pcVar3;
  char *pcVar4;
  _Bool _Var5;
  MCOperand *op;
  int64_t iVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  ulong uVar8;
  
  op = MCInst_getOperand(MI,0);
  _Var5 = MCOperand_isImm(op);
  if (_Var5) {
    iVar6 = MCOperand_getImm(op);
    uVar7 = (ulong)MI->flat_insn->size + iVar6 + MI->address;
    cVar2 = MI->csh->mode;
    uVar8 = uVar7 & 0xffffffff;
    if (cVar2 == CS_MODE_64) {
      uVar8 = uVar7;
    }
    if (cVar2 == CS_MODE_16) {
      if ((MI->Opcode != 0x163) && (MI->Opcode != 0x44f)) {
        uVar8 = uVar8 & 0xffff;
      }
    }
    if (((cVar2 == CS_MODE_16) && (MI->Opcode == 0x44f)) && (MI->x86_prefix[2] != 'f')) {
      uVar8 = uVar8 & 0xffff;
    }
    if ((MI->Opcode == 0x44e) || (MI->Opcode == 0x162)) {
      uVar8 = uVar8 & 0xffff;
    }
    pcVar4 = " + %lu";
    if (9 < uVar8) {
      pcVar4 = " + 0x%lx";
    }
    SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNo),pcVar4 + 3,uVar8);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar3 = MI->flat_insn->detail;
      puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x3e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      MI->has_imm = true;
      pcVar3 = MI->flat_insn->detail;
      *(ulong *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x46) =
           uVar8;
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

static void printPCRelImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op) + MI->flat_insn->size + MI->address;

		// truncat imm for non-64bit
		if (MI->csh->mode != CS_MODE_64) {
			imm = imm & 0xffffffff;
		}

		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode != X86_JMP_4 && MI->Opcode != X86_CALLpcrel32))
			imm = imm & 0xffff;

		// Hack: X86 16bit with opcode X86_JMP_4
		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode == X86_JMP_4 && MI->x86_prefix[2] != 0x66))
			imm = imm & 0xffff;

		// CALL/JMP rel16 is special
		if (MI->Opcode == X86_CALLpcrel16 || MI->Opcode == X86_JMP_2)
			imm = imm & 0xffff;

		if (imm < 0) {
			SStream_concat(O, "0x%"PRIx64, imm);
		} else {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
			MI->has_imm = true;
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;
			MI->flat_insn->detail->x86.op_count++;
		}
	}
}